

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

float duckdb::Cast::Operation<unsigned_int,float>(uint input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  float result;
  float local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_int,float>(input,&local_3c,false);
  if (bVar1) {
    return local_3c;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_int,float>(&local_38,(duckdb *)(ulong)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}